

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Echo.cpp
# Opt level: O0

void __thiscall helics::apps::Echo::runTo(Echo *this,Time stopTime_input)

{
  bool bVar1;
  element_type *peVar2;
  long *in_RDI;
  Time ctime;
  Modes md;
  undefined7 in_stack_00000050;
  IterationRequest in_stack_00000057;
  Time in_stack_00000058;
  TimeRepresentation<count_time<9,_long>_> local_20;
  Modes local_11;
  TimeRepresentation<count_time<9,_long>_> local_8;
  
  CLI::std::
  __shared_ptr_access<helics::CombinationFederate,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
  operator->((__shared_ptr_access<helics::CombinationFederate,_(__gnu_cxx::_Lock_policy)2,_false,_false>
              *)0x405b80);
  local_11 = Federate::getCurrentMode((Federate *)0x405b8f);
  if (local_11 == STARTUP) {
    (**(code **)(*in_RDI + 0x10))();
  }
  if ((char)local_11 < '\x02') {
    CLI::std::
    __shared_ptr_access<helics::CombinationFederate,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
    operator->((__shared_ptr_access<helics::CombinationFederate,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                *)0x405bb8);
    Federate::enterExecutingMode((Federate *)in_stack_00000058.internalTimeCode,in_stack_00000057);
  }
  else if (local_11 == FINALIZE) {
    return;
  }
  peVar2 = CLI::std::
           __shared_ptr_access<helics::CombinationFederate,_(__gnu_cxx::_Lock_policy)2,_false,_false>
           ::operator->((__shared_ptr_access<helics::CombinationFederate,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                         *)0x405be3);
  local_20.internalTimeCode =
       (baseType)
       Federate::getCurrentTime
                 ((Federate *)
                  ((long)&(peVar2->super_ValueFederate)._vptr_ValueFederate +
                  (long)(peVar2->super_ValueFederate)._vptr_ValueFederate[-3]));
  while (bVar1 = TimeRepresentation<count_time<9,_long>_>::operator<(&local_20,&local_8), bVar1) {
    CLI::std::
    __shared_ptr_access<helics::CombinationFederate,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
    operator->((__shared_ptr_access<helics::CombinationFederate,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                *)0x405c19);
    local_20.internalTimeCode =
         (baseType)
         Federate::requestTime
                   ((Federate *)CONCAT17(in_stack_00000057,in_stack_00000050),in_stack_00000058);
  }
  return;
}

Assistant:

void Echo::runTo(Time stopTime_input)
    {
        auto md = fed->getCurrentMode();
        if (md == Federate::Modes::STARTUP) {
            initialize();
        }
        if (md < Federate::Modes::EXECUTING) {
            fed->enterExecutingMode();
        } else if (md == Federate::Modes::FINALIZE) {
            return;
        }
        auto ctime = fed->getCurrentTime();
        while (ctime < stopTime_input) {
            ctime = fed->requestTime(stopTime_input);
        }
    }